

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-abstract.h
# Opt level: O1

void __thiscall dynamicgraph::ExceptionAbstract::~ExceptionAbstract(ExceptionAbstract *this)

{
  ~ExceptionAbstract(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit ExceptionAbstract(const int &code, const std::string &msg = "");
  virtual ~ExceptionAbstract() throw() {}